

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

string * SHA256AutoDetect_abi_cxx11_
                   (string *__return_storage_ptr__,UseImplementation use_implementation)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  undefined1 *puVar8;
  long in_FS_OFFSET;
  bool bVar9;
  uint in_XCR0;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint32_t state [8];
  uchar out [32];
  uchar local_158 [256];
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"standard","");
  (anonymous_namespace)::Transform = anon_unknown.dwarf_29f182::sha256::Transform;
  (anonymous_namespace)::TransformD64 = anon_unknown.dwarf_29f182::sha256::TransformD64;
  (anonymous_namespace)::TransformD64_2way = (code *)0x0;
  (anonymous_namespace)::TransformD64_4way = (code *)0x0;
  (anonymous_namespace)::TransformD64_8way = (code *)0x0;
  lVar1 = cpuid_Version_info(1);
  uVar2 = *(uint *)(lVar1 + 0xc);
  uVar5 = uVar2 >> 0x13;
  if ((use_implementation & USE_SSE4) == STANDARD) {
    uVar5 = use_implementation & 1;
  }
  bVar4 = 0;
  if ((uVar5 & 1) == 0) {
    bVar7 = 0;
  }
  else {
    lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
    bVar7 = (byte)(*(uint *)(lVar1 + 4) >> 5) & 7;
    if ((use_implementation & USE_AVX2) == STANDARD) {
      bVar7 = 0;
    }
    bVar4 = 0;
    if ((use_implementation & USE_SHANI) != STANDARD) {
      bVar4 = (byte)(*(uint *)(lVar1 + 4) >> 0x1d) & 1;
    }
  }
  if (bVar4 != 0) {
    (anonymous_namespace)::Transform = sha256_x86_shani::Transform;
    (anonymous_namespace)::TransformD64 =
         anon_unknown.dwarf_29f182::TransformD64Wrapper<&sha256_x86_shani::Transform>;
    (anonymous_namespace)::TransformD64_2way = sha256d64_x86_shani::Transform_2way;
    uVar5 = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,
               "x86_shani(1way,2way)",0x14);
    bVar7 = 0;
  }
  if ((uVar5 & 1) != 0) {
    (anonymous_namespace)::Transform = sha256_sse4::Transform;
    (anonymous_namespace)::TransformD64 =
         anon_unknown.dwarf_29f182::TransformD64Wrapper<&sha256_sse4::Transform>;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,"sse4(1way)",10);
    (anonymous_namespace)::TransformD64_4way = sha256d64_sse41::Transform_4way;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,",sse41(4way)");
  }
  if ((((~uVar2 & 0x18000000) == 0 && (~in_XCR0 & 6) == 0) && (~bVar7 & 1) == 0) &&
      (uVar2 >> 0x1c & 1) != 0) {
    (anonymous_namespace)::TransformD64_8way = sha256d64_avx2::Transform_8way;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,",avx2(8way)");
  }
  puVar8 = (anonymous_namespace)::SelfTest()::result;
  bVar9 = false;
  uVar6 = 0;
  do {
    local_158[0x10] = '\x7f';
    local_158[0x11] = 'R';
    local_158[0x12] = '\x0e';
    local_158[0x13] = 'Q';
    local_158[0x14] = 0x8c;
    local_158[0x15] = 'h';
    local_158[0x16] = '\x05';
    local_158[0x17] = 0x9b;
    local_158[0x18] = 0xab;
    local_158[0x19] = 0xd9;
    local_158[0x1a] = 0x83;
    local_158[0x1b] = '\x1f';
    local_158[0x1c] = '\x19';
    local_158[0x1d] = 0xcd;
    local_158[0x1e] = 0xe0;
    local_158[0x1f] = '[';
    local_158[0] = 'g';
    local_158[1] = 0xe6;
    local_158[2] = '\t';
    local_158[3] = 'j';
    local_158[4] = 0x85;
    local_158[5] = 0xae;
    local_158[6] = 'g';
    local_158[7] = 0xbb;
    local_158[8] = 'r';
    local_158[9] = 0xf3;
    local_158[10] = 'n';
    local_158[0xb] = '<';
    local_158[0xc] = ':';
    local_158[0xd] = 0xf5;
    local_158[0xe] = 'O';
    local_158[0xf] = 0xa5;
    (*(code *)(anonymous_namespace)::Transform)
              (local_158,
               "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
               ,uVar6);
    auVar12[0] = -(puVar8[0x10] == local_158[0x10]);
    auVar12[1] = -(puVar8[0x11] == local_158[0x11]);
    auVar12[2] = -(puVar8[0x12] == local_158[0x12]);
    auVar12[3] = -(puVar8[0x13] == local_158[0x13]);
    auVar12[4] = -(puVar8[0x14] == local_158[0x14]);
    auVar12[5] = -(puVar8[0x15] == local_158[0x15]);
    auVar12[6] = -(puVar8[0x16] == local_158[0x16]);
    auVar12[7] = -(puVar8[0x17] == local_158[0x17]);
    auVar12[8] = -(puVar8[0x18] == local_158[0x18]);
    auVar12[9] = -(puVar8[0x19] == local_158[0x19]);
    auVar12[10] = -(puVar8[0x1a] == local_158[0x1a]);
    auVar12[0xb] = -(puVar8[0x1b] == local_158[0x1b]);
    auVar12[0xc] = -(puVar8[0x1c] == local_158[0x1c]);
    auVar12[0xd] = -(puVar8[0x1d] == local_158[0x1d]);
    auVar12[0xe] = -(puVar8[0x1e] == local_158[0x1e]);
    auVar12[0xf] = -(puVar8[0x1f] == local_158[0x1f]);
    auVar10[0] = -(*puVar8 == local_158[0]);
    auVar10[1] = -(puVar8[1] == local_158[1]);
    auVar10[2] = -(puVar8[2] == local_158[2]);
    auVar10[3] = -(puVar8[3] == local_158[3]);
    auVar10[4] = -(puVar8[4] == local_158[4]);
    auVar10[5] = -(puVar8[5] == local_158[5]);
    auVar10[6] = -(puVar8[6] == local_158[6]);
    auVar10[7] = -(puVar8[7] == local_158[7]);
    auVar10[8] = -(puVar8[8] == local_158[8]);
    auVar10[9] = -(puVar8[9] == local_158[9]);
    auVar10[10] = -(puVar8[10] == local_158[10]);
    auVar10[0xb] = -(puVar8[0xb] == local_158[0xb]);
    auVar10[0xc] = -(puVar8[0xc] == local_158[0xc]);
    auVar10[0xd] = -(puVar8[0xd] == local_158[0xd]);
    auVar10[0xe] = -(puVar8[0xe] == local_158[0xe]);
    auVar10[0xf] = -(puVar8[0xf] == local_158[0xf]);
    auVar10 = auVar10 & auVar12;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff) {
      if (!bVar9) goto LAB_0015d8a2;
      break;
    }
    bVar9 = 7 < uVar6;
    uVar6 = uVar6 + 1;
    puVar8 = puVar8 + 0x20;
  } while (uVar6 != 9);
  (*(code *)(anonymous_namespace)::TransformD64)
            (&local_58,
             "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
            );
  auVar13[0] = -(local_48 == -4);
  auVar13[1] = -(cStack_47 == 'R');
  auVar13[2] = -(cStack_46 == -0x29);
  auVar13[3] = -(cStack_45 == -0x25);
  auVar13[4] = -(cStack_44 == '\a');
  auVar13[5] = -(cStack_43 == 'c');
  auVar13[6] = -(cStack_42 == 'E');
  auVar13[7] = -(cStack_41 == -5);
  auVar13[8] = -(cStack_40 == 'S');
  auVar13[9] = -(cStack_3f == '\x14');
  auVar13[10] = -(cStack_3e == '}');
  auVar13[0xb] = -(cStack_3d == '\x17');
  auVar13[0xc] = -(cStack_3c == '\"');
  auVar13[0xd] = -(cStack_3b == -0x7a);
  auVar13[0xe] = -(cStack_3a == -0x10);
  auVar13[0xf] = -(cStack_39 == 'R');
  auVar11[0] = -(local_58 == '\t');
  auVar11[1] = -(cStack_57 == ':');
  auVar11[2] = -(cStack_56 == -0x3c);
  auVar11[3] = -(cStack_55 == -0x30);
  auVar11[4] = -(cStack_54 == '\x0f');
  auVar11[5] = -(cStack_53 == -9);
  auVar11[6] = -(cStack_52 == 'W');
  auVar11[7] = -(cStack_51 == -0x1f);
  auVar11[8] = -(cStack_50 == 'r');
  auVar11[9] = -(cStack_4f == -0x7b);
  auVar11[10] = -(cStack_4e == 'y');
  auVar11[0xb] = -(cStack_4d == 'B');
  auVar11[0xc] = -(cStack_4c == -2);
  auVar11[0xd] = -(cStack_4b == -0x19);
  auVar11[0xe] = -(cStack_4a == -0x20);
  auVar11[0xf] = -(cStack_49 == -0x60);
  auVar11 = auVar11 & auVar13;
  if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) {
LAB_0015d8a2:
    __assert_fail("SelfTest()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/sha256.cpp"
                  ,0x2b2,"std::string SHA256AutoDetect(sha256_implementation::UseImplementation)");
  }
  if ((anonymous_namespace)::TransformD64_2way != (code *)0x0) {
    sha256d64_x86_shani::Transform_2way
              (local_158,
               "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
              );
    iVar3 = bcmp(local_158,(anonymous_namespace)::SelfTest()::result_d64,0x40);
    if (iVar3 != 0) goto LAB_0015d8a2;
  }
  if ((anonymous_namespace)::TransformD64_4way != (code *)0x0) {
    sha256d64_sse41::Transform_4way
              (local_158,
               "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
              );
    iVar3 = bcmp(local_158,(anonymous_namespace)::SelfTest()::result_d64,0x80);
    if (iVar3 != 0) goto LAB_0015d8a2;
  }
  if ((anonymous_namespace)::TransformD64_8way != (code *)0x0) {
    sha256d64_avx2::Transform_8way
              (local_158,
               "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
              );
    iVar3 = bcmp(local_158,(anonymous_namespace)::SelfTest()::result_d64,0x100);
    if (iVar3 != 0) goto LAB_0015d8a2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SHA256AutoDetect(sha256_implementation::UseImplementation use_implementation)
{
    std::string ret = "standard";
    Transform = sha256::Transform;
    TransformD64 = sha256::TransformD64;
    TransformD64_2way = nullptr;
    TransformD64_4way = nullptr;
    TransformD64_8way = nullptr;

#if !defined(DISABLE_OPTIMIZED_SHA256)
#if defined(HAVE_GETCPUID)
    bool have_sse4 = false;
    bool have_xsave = false;
    bool have_avx = false;
    [[maybe_unused]] bool have_avx2 = false;
    [[maybe_unused]] bool have_x86_shani = false;
    [[maybe_unused]] bool enabled_avx = false;

    uint32_t eax, ebx, ecx, edx;
    GetCPUID(1, 0, eax, ebx, ecx, edx);
    if (use_implementation & sha256_implementation::USE_SSE4) {
        have_sse4 = (ecx >> 19) & 1;
    }
    have_xsave = (ecx >> 27) & 1;
    have_avx = (ecx >> 28) & 1;
    if (have_xsave && have_avx) {
        enabled_avx = AVXEnabled();
    }
    if (have_sse4) {
        GetCPUID(7, 0, eax, ebx, ecx, edx);
        if (use_implementation & sha256_implementation::USE_AVX2) {
            have_avx2 = (ebx >> 5) & 1;
        }
        if (use_implementation & sha256_implementation::USE_SHANI) {
            have_x86_shani = (ebx >> 29) & 1;
        }
    }

#if defined(ENABLE_SSE41) && defined(ENABLE_X86_SHANI)
    if (have_x86_shani) {
        Transform = sha256_x86_shani::Transform;
        TransformD64 = TransformD64Wrapper<sha256_x86_shani::Transform>;
        TransformD64_2way = sha256d64_x86_shani::Transform_2way;
        ret = "x86_shani(1way,2way)";
        have_sse4 = false; // Disable SSE4/AVX2;
        have_avx2 = false;
    }
#endif

    if (have_sse4) {
#if defined(__x86_64__) || defined(__amd64__)
        Transform = sha256_sse4::Transform;
        TransformD64 = TransformD64Wrapper<sha256_sse4::Transform>;
        ret = "sse4(1way)";
#endif
#if defined(ENABLE_SSE41)
        TransformD64_4way = sha256d64_sse41::Transform_4way;
        ret += ",sse41(4way)";
#endif
    }

#if defined(ENABLE_AVX2)
    if (have_avx2 && have_avx && enabled_avx) {
        TransformD64_8way = sha256d64_avx2::Transform_8way;
        ret += ",avx2(8way)";
    }
#endif
#endif // defined(HAVE_GETCPUID)

#if defined(ENABLE_ARM_SHANI)
    bool have_arm_shani = false;
    if (use_implementation & sha256_implementation::USE_SHANI) {
#if defined(__linux__)
#if defined(__arm__) // 32-bit
        if (getauxval(AT_HWCAP2) & HWCAP2_SHA2) {
            have_arm_shani = true;
        }
#endif
#if defined(__aarch64__) // 64-bit
        if (getauxval(AT_HWCAP) & HWCAP_SHA2) {
            have_arm_shani = true;
        }
#endif
#endif

#if defined(__APPLE__)
        int val = 0;
        size_t len = sizeof(val);
        if (sysctlbyname("hw.optional.arm.FEAT_SHA256", &val, &len, nullptr, 0) == 0) {
            have_arm_shani = val != 0;
        }
#endif
    }

    if (have_arm_shani) {
        Transform = sha256_arm_shani::Transform;
        TransformD64 = TransformD64Wrapper<sha256_arm_shani::Transform>;
        TransformD64_2way = sha256d64_arm_shani::Transform_2way;
        ret = "arm_shani(1way,2way)";
    }
#endif
#endif // DISABLE_OPTIMIZED_SHA256

    assert(SelfTest());
    return ret;
}